

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

int scp_send_errmsg(char *str)

{
  Backend *be;
  size_t len;
  char *str_local;
  
  if (!using_sftp) {
    backend_send(backend,anon_var_dwarf_23ee3 + 9,1);
    be = backend;
    len = strlen(str);
    backend_send(be,str,len);
  }
  return 0;
}

Assistant:

int scp_send_errmsg(char *str)
{
    if (using_sftp) {
        /* do nothing; we never need to send our errors to the server */
    } else {
        backend_send(backend, "\001", 1);/* scp protocol error prefix */
        backend_send(backend, str, strlen(str));
    }
    return 0;                          /* can't fail */
}